

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O3

void __thiscall GraphTestRootNodes::Run(GraphTestRootNodes *this)

{
  pointer pcVar1;
  Test *this_00;
  int iVar2;
  State *state;
  ulong uVar3;
  vector<Node_*,_std::allocator<Node_*>_> root_nodes;
  string err;
  string name;
  vector<Node_*,_std::allocator<Node_*>_> local_a8;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  iVar2 = g_current_test->assertion_failures_;
  state = &(this->super_GraphTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "build out1: cat in1\nbuild mid1: cat in1\nbuild out2: cat mid1\nbuild out3 out4: cat mid1\n"
              ,(ManifestParserOptions)0x0);
  if (iVar2 == g_current_test->assertion_failures_) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    State::RootNodes(&local_a8,state,&local_90);
    testing::Test::Check
              (g_current_test,
               (long)local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start == 0x20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0xd3,"4u == root_nodes.size()");
    if (local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_finish !=
        local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      uVar3 = 0;
      do {
        pcVar1 = (local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3]->path_)._M_dataplus._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar1,
                   pcVar1 + (local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar3]->path_)._M_string_length);
        this_00 = g_current_test;
        std::__cxx11::string::substr((ulong)local_70,(ulong)local_50);
        iVar2 = std::__cxx11::string::compare((char *)local_70);
        testing::Test::Check
                  (this_00,iVar2 == 0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                   ,0xd6,"\"out\" == name.substr(0, 3)");
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)((long)local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(GraphTest, RootNodes) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out1: cat in1\n"
"build mid1: cat in1\n"
"build out2: cat mid1\n"
"build out3 out4: cat mid1\n"));

  string err;
  vector<Node*> root_nodes = state_.RootNodes(&err);
  EXPECT_EQ(4u, root_nodes.size());
  for (size_t i = 0; i < root_nodes.size(); ++i) {
    string name = root_nodes[i]->path();
    EXPECT_EQ("out", name.substr(0, 3));
  }
}